

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Options *options)

{
  ulong uVar1;
  int iVar2;
  pointer pcVar3;
  long *plVar4;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_04;
  ExtensionGenerator *this_05;
  bool in_CL;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  this->descriptor_ = descriptor;
  ClassName_abi_cxx11_(&this->classname_,(cxx *)descriptor,(Descriptor *)0x0,in_CL);
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar3 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->options_,pcVar3,pcVar3 + (options->dllexport_decl)._M_string_length);
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  FieldGeneratorMap::FieldGeneratorMap(&this->field_generators_,descriptor,options);
  iVar2 = *(int *)(descriptor + 0x38);
  lVar6 = (long)iVar2;
  uVar1 = lVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar6;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->nested_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *)(plVar4 + 1);
  iVar2 = *(int *)(descriptor + 0x48);
  lVar6 = (long)iVar2;
  uVar1 = lVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar6;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->enum_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *)(plVar4 + 1);
  iVar2 = *(int *)(descriptor + 0x68);
  lVar6 = (long)iVar2;
  uVar1 = lVar6 * 8;
  uVar5 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar4 = (long *)operator_new__(uVar5);
  *plVar4 = lVar6;
  if (iVar2 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *)(plVar4 + 1);
  if (0 < *(int *)(descriptor + 0x38)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      this_00 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
                ::operator[](&this->nested_generators_,lVar6);
      this_01 = (MessageGenerator *)operator_new(0x78);
      MessageGenerator(this_01,(Descriptor *)(*(long *)(descriptor + 0x40) + lVar7),options);
      internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::reset
                (this_00,this_01);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar6 < *(int *)(descriptor + 0x38));
  }
  if (0 < *(int *)(descriptor + 0x48)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      this_02 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
                ::operator[](&this->enum_generators_,lVar6);
      this_03 = (EnumGenerator *)operator_new(0x50);
      EnumGenerator::EnumGenerator
                (this_03,(EnumDescriptor *)(*(long *)(descriptor + 0x50) + lVar7),options);
      internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::reset(this_02,this_03);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x38;
    } while (lVar6 < *(int *)(descriptor + 0x48));
  }
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      this_04 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_,lVar6);
      this_05 = (ExtensionGenerator *)operator_new(0x50);
      ExtensionGenerator::ExtensionGenerator
                (this_05,(FieldDescriptor *)(*(long *)(descriptor + 0x70) + lVar7),options);
      internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::reset
                (this_04,this_05);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar6 < *(int *)(descriptor + 0x68));
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options),
    field_generators_(descriptor, options),
    nested_generators_(new scoped_ptr<MessageGenerator>[
      descriptor->nested_type_count()]),
    enum_generators_(new scoped_ptr<EnumGenerator>[
      descriptor->enum_type_count()]),
    extension_generators_(new scoped_ptr<ExtensionGenerator>[
      descriptor->extension_count()]) {

  for (int i = 0; i < descriptor->nested_type_count(); i++) {
    nested_generators_[i].reset(
      new MessageGenerator(descriptor->nested_type(i), options));
  }

  for (int i = 0; i < descriptor->enum_type_count(); i++) {
    enum_generators_[i].reset(
      new EnumGenerator(descriptor->enum_type(i), options));
  }

  for (int i = 0; i < descriptor->extension_count(); i++) {
    extension_generators_[i].reset(
      new ExtensionGenerator(descriptor->extension(i), options));
  }
}